

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

int Gem_ManFree(Gem_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  int *piVar2;
  long lVar3;
  
  pVVar1 = p->vTtMem;
  if (pVVar1 != (Vec_Mem_t *)0x0) {
    if (pVVar1->vTable != (Vec_Int_t *)0x0) {
      piVar2 = pVVar1->vTable->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pVVar1->vTable->pArray = (int *)0x0;
      }
      if (pVVar1->vTable != (Vec_Int_t *)0x0) {
        free(pVVar1->vTable);
        pVVar1->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
      piVar2 = pVVar1->vNexts->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pVVar1->vNexts->pArray = (int *)0x0;
      }
      if (pVVar1->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar1->vNexts);
        pVVar1->vNexts = (Vec_Int_t *)0x0;
      }
    }
  }
  pVVar1 = p->vTtMem;
  if (-1 < pVVar1->iPage) {
    lVar3 = -1;
    do {
      if (pVVar1->ppPages[lVar3 + 1] != (word *)0x0) {
        free(pVVar1->ppPages[lVar3 + 1]);
        pVVar1->ppPages[lVar3 + 1] = (word *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar1->iPage);
  }
  if (pVVar1->ppPages != (word **)0x0) {
    free(pVVar1->ppPages);
    pVVar1->ppPages = (word **)0x0;
  }
  if (pVVar1 != (Vec_Mem_t *)0x0) {
    free(pVVar1);
  }
  if (p->pTtElems != (word **)0x0) {
    free(p->pTtElems);
    p->pTtElems = (word **)0x0;
  }
  if (p->pObjs != (Gem_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Gem_Obj_t *)0x0;
  }
  if (p != (Gem_Man_t *)0x0) {
    free(p);
  }
  return 1;
}

Assistant:

int Gem_ManFree( Gem_Man_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pTtElems );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
    return 1;
}